

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameOperator.cpp
# Opt level: O0

int __thiscall GameOperator::getkey(GameOperator *this)

{
  int iVar1;
  undefined1 local_88 [4];
  int ch;
  termios newattr;
  termios oldattr;
  GameOperator *this_local;
  
  tcgetattr(0,(termios *)&newattr.c_ispeed);
  memcpy(local_88,&newattr.c_ispeed,0x3c);
  newattr.c_oflag = newattr.c_oflag & 0xfffffff5;
  tcsetattr(0,0,(termios *)local_88);
  iVar1 = getchar();
  tcsetattr(0,0,(termios *)&newattr.c_ispeed);
  return iVar1;
}

Assistant:

int GameOperator::getkey() {
#ifdef _WIN32
    return getch();
#else
    struct termios oldattr, newattr;
    int ch;
    tcgetattr(STDIN_FILENO, &oldattr);
    newattr = oldattr;
    newattr.c_lflag &= ~(ICANON | ECHO);
    tcsetattr(STDIN_FILENO, TCSANOW, &newattr);
    ch = getchar();
    tcsetattr(STDIN_FILENO, TCSANOW, &oldattr);
    return ch;
#endif
}